

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::FederateState::waitCommand_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FederateState *this)

{
  CommonCore *pCVar1;
  int iVar2;
  undefined4 local_68;
  undefined4 uStack_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
  ::pop(__return_storage_ptr__,&this->commandQueue);
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,"notify");
  if (iVar2 == 0) {
    pCVar1 = this->mParent;
    if (pCVar1 != (CommonCore *)0x0) {
      local_68 = (undefined4)(this->name)._M_string_length;
      uStack_60 = SUB84((this->name)._M_dataplus._M_p,0);
      (*(pCVar1->super_Core)._vptr_Core[0x5b])
                (pCVar1,(__return_storage_ptr__->second)._M_string_length,
                 (__return_storage_ptr__->second)._M_dataplus._M_p,0xf,"notify_response",0,local_68,
                 uStack_60);
    }
    gmlc::containers::
    BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
    ::pop(&local_58,&this->commandQueue);
    waitCommand_abi_cxx11_();
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> FederateState::waitCommand()
{
    auto val = commandQueue.pop();
    if (val.first == "notify") {
        if (mParent != nullptr) {
            mParent->sendCommand(val.second,
                                 "notify_response",
                                 name,
                                 HelicsSequencingModes::HELICS_SEQUENCING_MODE_FAST);
        }
        val = commandQueue.pop();
    }
    return val;
}